

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpRepeatedMessageOrGroup<false,false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  undefined1 auVar5 [12];
  int iVar6;
  MessageLite *msg_00;
  ushort *puVar7;
  ulong uVar8;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar9;
  ushort uVar10;
  TcParseTableBase *pTVar11;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar12;
  undefined8 extraout_RDX;
  ParseContext *extraout_RDX_00;
  uint uVar13;
  RepeatedPtrFieldBase *ptr_00;
  uint *puVar14;
  int iVar15;
  byte *p;
  pair<const_char_*,_int> pVar16;
  pair<const_char_*,_unsigned_int> pVar17;
  TcParseTableBase *local_68;
  RepeatedPtrFieldBase *local_48;
  int local_40;
  ParseContext *ctx_00;
  
  puVar14 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar14 & 3) != 0) {
LAB_002863fa:
    AlignFail();
  }
  uVar3 = *(ushort *)((long)puVar14 + 10);
  if ((uVar3 & 0x30) == 0x20) {
    if ((uVar3 & 0x1c0) == 0) {
      if ((data.field_0._0_4_ & 7) != 2) {
        UNRECOVERED_JUMPTABLE = table->fallback;
LAB_00286378:
        pcVar9 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
        return pcVar9;
      }
      local_48 = (RepeatedPtrFieldBase *)((long)&msg->_vptr_MessageLite + (ulong)*puVar14);
      if (((ulong)local_48 & 7) == 0) {
        local_68 = *(TcParseTableBase **)
                    ((long)&table->has_bits_offset +
                    (ulong)(ushort)puVar14[2] * 8 + (ulong)table->aux_offset);
        uVar10 = uVar3 >> 9 & 3;
        p = (byte *)ptr;
        if (uVar10 != 2) {
          if ((uVar3 >> 9 & 3) == 0) {
            MpRepeatedMessageOrGroup<false,false>((TcParser *)&stack0xffffffffffffffc0);
            goto LAB_00286451;
          }
          if (uVar10 != 1) {
            local_68 = *(TcParseTableBase **)local_68;
          }
          local_68 = MessageLite::GetTcParseTable((MessageLite *)local_68);
        }
        do {
          ptr_00 = local_48;
          msg_00 = AddMessage(local_68,local_48);
          bVar1 = *p;
          aVar12.data._1_7_ = 0;
          aVar12.data._0_1_ = bVar1;
          if ((char)bVar1 < '\0') {
            ptr_00 = (RepeatedPtrFieldBase *)(ulong)(uint)bVar1;
            pVar16 = ReadSizeFallback((char *)p,(uint)bVar1);
            ctx_00 = pVar16._8_8_;
            if (pVar16.first == (char *)0x0) goto LAB_00286388;
            aVar12.data = (ulong)ctx_00 & 0xffffffff;
          }
          else {
            pVar16._8_8_ = extraout_RDX;
            pVar16.first = (char *)(p + 1);
          }
          ctx_00 = pVar16._8_8_;
          if (ctx->depth_ < 1) goto LAB_00286388;
          EpsCopyInputStream::PushLimit
                    ((EpsCopyInputStream *)&stack0xffffffffffffffc0,(char *)ctx,(int)pVar16.first);
          iVar6 = local_40;
          iVar15 = ctx->depth_ + -1;
          ctx->depth_ = iVar15;
          pTVar11 = local_68;
          ptr = ParseLoopPreserveNone(msg_00,pVar16.first,ctx,local_68);
          iVar4 = ctx->depth_;
          aVar12.data._1_7_ = (undefined7)((ulong)pTVar11 >> 8);
          aVar12.data._0_1_ = iVar15 == iVar4 || (ushort *)ptr == (ushort *)0x0;
          if (iVar15 != iVar4 && (ushort *)ptr != (ushort *)0x0) {
            MpRepeatedMessageOrGroup<false,false>();
            goto LAB_002863fa;
          }
          ptr_00 = (RepeatedPtrFieldBase *)(ulong)(iVar4 + 1U);
          ctx->depth_ = iVar4 + 1U;
          uVar13 = iVar6 + (ctx->super_EpsCopyInputStream).limit_;
          (ctx->super_EpsCopyInputStream).limit_ = uVar13;
          ctx_00 = extraout_RDX_00;
          if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) {
LAB_00286388:
            pcVar9 = Error(msg,(char *)ptr_00,ctx_00,(TcFieldData)aVar12,table,hasbits);
            return pcVar9;
          }
          puVar7 = (ushort *)
                   ((ctx->super_EpsCopyInputStream).buffer_end_ +
                   (int)((int)uVar13 >> 0x1f & uVar13));
          (ctx->super_EpsCopyInputStream).limit_end_ = (char *)puVar7;
          if ((ushort *)ptr == (ushort *)0x0) goto LAB_00286388;
          if (puVar7 <= ptr) {
            uVar8 = (ulong)table->has_bits_offset;
            if (uVar8 == 0) {
              return (char *)(ushort *)ptr;
            }
            goto LAB_002863b7;
          }
          bVar1 = (byte)*(ushort *)ptr;
          auVar5[8] = bVar1;
          auVar5._0_8_ = (byte *)((long)ptr + 1);
          auVar5._9_3_ = 0;
          if ((char)bVar1 < '\0') {
            bVar2 = *(byte *)((long)ptr + 1);
            aVar12.data = (ulong)bVar2 << 7;
            uVar13 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            if ((char)bVar2 < '\0') {
              ptr_00 = (RepeatedPtrFieldBase *)(ulong)uVar13;
              pVar17 = ReadTagFallback(ptr,uVar13);
              auVar5 = pVar17._0_12_;
              ctx_00 = pVar17._8_8_;
              if (pVar17.first == (char *)0x0) goto LAB_00286388;
            }
            else {
              auVar5._8_4_ = uVar13;
              auVar5._0_8_ = (ushort *)((long)ptr + 2);
            }
          }
          p = auVar5._0_8_;
        } while (auVar5._8_4_ == data.field_0._0_4_);
        if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
          uVar8 = (ulong)table->has_bits_offset;
          if (uVar8 != 0) {
LAB_002863b7:
            puVar14 = (uint *)((long)&msg->_vptr_MessageLite + uVar8);
            if (((ulong)puVar14 & 3) != 0) goto LAB_002863fa;
            *puVar14 = *puVar14 | (uint)hasbits;
          }
          return (char *)(ushort *)ptr;
        }
        uVar13 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
        if ((uVar13 & 7) != 0) {
LAB_00286451:
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        uVar8 = (ulong)(uVar13 & 0xfffffff8);
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar8 * 2));
        UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar8);
        goto LAB_00286378;
      }
      goto LAB_00286417;
    }
  }
  else {
    MpRepeatedMessageOrGroup<false,false>();
  }
  MpRepeatedMessageOrGroup<false,false>();
LAB_00286417:
  AlignFail(local_48);
}

Assistant:

const char* TcParser::MpRepeatedMessageOrGroup(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  ABSL_DCHECK_EQ(type_card & field_layout::kFcMask,
                 static_cast<uint16_t>(field_layout::kFcRepeated));
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Validate wiretype:
  if (!is_group) {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepMessage));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepGroup));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  RepeatedPtrFieldBase& field =
      MaybeCreateRepeatedRefAt<RepeatedPtrFieldBase, is_split>(
          base, entry.offset, msg);
  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));

  const char* ptr2 = ptr;
  uint32_t next_tag;
  do {
    MessageLite* value = AddMessage(inner_table, field);
    const auto inner_loop = [&](const char* ptr) {
      return ParseLoopPreserveNone(value, ptr, ctx, inner_table);
    };
    ptr = is_group ? ctx->ParseGroupInlined(ptr2, decoded_tag, inner_loop)
                   : ctx->ParseLengthDelimitedInlined(ptr2, inner_loop);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}